

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraKateGenerator.cxx
# Opt level: O0

void __thiscall
cmExtraKateGenerator::AppendTarget
          (cmExtraKateGenerator *this,cmGeneratedFileStream *fout,string *target,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *configs,string *make,string *makeArgs,string *path,string *homeOutputDir)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  ostream *poVar4;
  size_type sVar5;
  string *local_158;
  allocator<char> local_111;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  byte local_ad;
  byte local_9a;
  allocator<char> local_99;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  reference local_58;
  string *conf;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  string *makeArgs_local;
  string *make_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *configs_local;
  string *target_local;
  cmGeneratedFileStream *fout_local;
  cmExtraKateGenerator *this_local;
  
  __end1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(configs);
  conf = (string *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end(configs);
  while (bVar3 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     *)&conf), bVar3) {
    local_58 = __gnu_cxx::
               __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&__end1);
    poVar4 = std::operator<<((ostream *)fout,"\t\t\t");
    poVar4 = std::operator<<(poVar4,AppendTarget::JsonSep);
    poVar4 = std::operator<<(poVar4,"{\"name\":\"");
    poVar4 = std::operator<<(poVar4,(string *)target);
    sVar5 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(configs);
    local_9a = 0;
    local_ad = 0;
    if (sVar5 < 2) {
      std::__cxx11::string::string((string *)&local_78);
    }
    else {
      std::allocator<char>::allocator();
      local_9a = 1;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,":",&local_99);
      local_ad = 1;
      std::operator+(&local_78,&local_98,local_58);
    }
    poVar4 = std::operator<<(poVar4,(string *)&local_78);
    poVar4 = std::operator<<(poVar4,"\", \"build_cmd\":\"");
    poVar4 = std::operator<<(poVar4,(string *)make);
    poVar4 = std::operator<<(poVar4," -C \\\"");
    if ((this->UseNinja & 1U) == 0) {
      local_158 = path;
    }
    else {
      local_158 = homeOutputDir;
    }
    poVar4 = std::operator<<(poVar4,(string *)local_158);
    poVar4 = std::operator<<(poVar4,"\\\" ");
    bVar2 = false;
    bVar1 = false;
    bVar3 = false;
    if (((this->UseNinja & 1U) == 0) ||
       (sVar5 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size(configs), sVar5 < 2)) {
      std::__cxx11::string::string((string *)&local_d0);
    }
    else {
      std::allocator<char>::allocator();
      bVar2 = true;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_110," -f build-",&local_111);
      bVar1 = true;
      std::operator+(&local_f0,&local_110,local_58);
      bVar3 = true;
      std::operator+(&local_d0,&local_f0,".ninja");
    }
    poVar4 = std::operator<<(poVar4,(string *)&local_d0);
    poVar4 = std::operator<<(poVar4,(string *)makeArgs);
    poVar4 = std::operator<<(poVar4," ");
    poVar4 = std::operator<<(poVar4,(string *)target);
    std::operator<<(poVar4,"\"}\n");
    std::__cxx11::string::~string((string *)&local_d0);
    if (bVar3) {
      std::__cxx11::string::~string((string *)&local_f0);
    }
    if (bVar1) {
      std::__cxx11::string::~string((string *)&local_110);
    }
    if (bVar2) {
      std::allocator<char>::~allocator(&local_111);
    }
    std::__cxx11::string::~string((string *)&local_78);
    if ((local_ad & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_98);
    }
    if ((local_9a & 1) != 0) {
      std::allocator<char>::~allocator(&local_99);
    }
    AppendTarget::JsonSep = ',';
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1);
  }
  return;
}

Assistant:

void cmExtraKateGenerator::AppendTarget(
  cmGeneratedFileStream& fout, const std::string& target,
  const std::vector<std::string>& configs, const std::string& make,
  const std::string& makeArgs, const std::string& path,
  const std::string& homeOutputDir) const
{
  static char JsonSep = ' ';

  for (const std::string& conf : configs) {
    fout << "\t\t\t" << JsonSep << R"({"name":")" << target
         << ((configs.size() > 1) ? (std::string(":") + conf) : std::string())
         << "\", "
            "\"build_cmd\":\""
         << make << " -C \\\"" << (this->UseNinja ? homeOutputDir : path)
         << "\\\" "
         << ((this->UseNinja && configs.size() > 1)
               ? std::string(" -f build-") + conf + ".ninja"
               : std::string())
         << makeArgs << " " << target << "\"}\n";

    JsonSep = ',';
  }
}